

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

bool __thiscall
duckdb::CatalogSet::StartChain
          (CatalogSet *this,CatalogTransaction transaction,string *name,
          unique_lock<std::mutex> *read_lock)

{
  CatalogTransaction transaction_00;
  bool bVar1;
  pointer pIVar2;
  CatalogSet *in_RDI;
  string *unaff_retaddr;
  CatalogSet *in_stack_00000008;
  undefined8 in_stack_00000020;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
  *in_stack_00000028;
  CatalogEntryMap *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  templated_unique_single_t dummy_node;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  DuckCatalog *in_stack_ffffffffffffff70;
  optional_ptr<duckdb::CatalogSet,_true> local_78 [3];
  undefined1 local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  __atomic_base<unsigned_long> *p_Stack_38;
  CatalogEntry *local_28 [4];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar3;
  
  memcpy(&local_58._M_string_length,&stack0x00000008,0x28);
  transaction_00.context.ptr = (ClientContext *)in_stack_00000028;
  transaction_00.db.ptr = (DatabaseInstance *)in_stack_00000020;
  transaction_00.transaction.ptr = (Transaction *)in_stack_00000030;
  transaction_00.transaction_id = in_stack_00000038._0_8_;
  transaction_00.start_time = in_stack_00000038._8_8_;
  local_28[0] = (CatalogEntry *)
                CreateDefaultEntry(in_stack_00000008,transaction_00,unaff_retaddr,
                                   (unique_lock<std::mutex> *)
                                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)local_28);
  if (bVar1) {
    bVar3 = 0;
  }
  else {
    local_59 = 0;
    make_uniq<duckdb::InCatalogEntry,duckdb::CatalogType,duckdb::DuckCatalog&,std::__cxx11::string_const&>
              ((CatalogType *)in_RDI,in_stack_ffffffffffffff70,&local_58);
    unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
    operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                *)local_58.field_2._M_allocated_capacity);
    ::std::__atomic_base<unsigned_long>::operator=(p_Stack_38,local_58.field_2._8_8_);
    pIVar2 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)local_58.field_2._M_allocated_capacity);
    (pIVar2->super_CatalogEntry).deleted = true;
    optional_ptr<duckdb::CatalogSet,_true>::optional_ptr(local_78,in_RDI);
    pIVar2 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)local_58.field_2._M_allocated_capacity);
    (pIVar2->super_CatalogEntry).set.ptr = local_78[0].ptr;
    unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>::
    unique_ptr<duckdb::InCatalogEntry,std::default_delete<std::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>>>,void>
              ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               local_58.field_2._M_allocated_capacity,
               (unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>_> *)
               local_58._M_string_length);
    CatalogEntryMap::AddEntry(in_stack_00000030,in_stack_00000028);
    unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::~unique_ptr
              ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               0x2a4a96);
    bVar3 = 1;
    unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
    ~unique_ptr((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                 *)0x2a4aab);
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool CatalogSet::StartChain(CatalogTransaction transaction, const string &name, unique_lock<mutex> &read_lock) {
	D_ASSERT(!map.GetEntry(name));

	// check if there is a default entry
	auto entry = CreateDefaultEntry(transaction, name, read_lock);
	if (entry) {
		return false;
	}

	// first create a dummy deleted entry
	// so other transactions will see that instead of the entry that is to be added.
	auto dummy_node = make_uniq<InCatalogEntry>(CatalogType::INVALID, catalog, name);
	dummy_node->timestamp = 0;
	dummy_node->deleted = true;
	dummy_node->set = this;

	map.AddEntry(std::move(dummy_node));
	return true;
}